

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O3

void __thiscall
agge::tests::DashTests::ClosedPolygonProducesDashesForTheClosingSegment(DashTests *this)

{
  undefined8 uVar1;
  bool bVar2;
  FailedAssertion *this_00;
  long lVar3;
  undefined8 *puVar4;
  point *ppVar5;
  byte bVar6;
  dash d;
  point reference [10];
  dash local_1e0;
  point local_188 [10];
  point local_108;
  real_t local_fc;
  real_t rStack_f8;
  int local_f4;
  point local_f0;
  point local_e4;
  point local_d8;
  point local_cc;
  point local_c0;
  point local_b4;
  point local_a8;
  point local_9c;
  string local_90;
  string local_70;
  LocationInfo local_50;
  
  bVar6 = 0;
  dash::dash(&local_1e0);
  dash::add_dash(&local_1e0,2.0,1.0);
  dash::add_vertex(&local_1e0,-2.0,2.0,1);
  dash::add_vertex(&local_1e0,-2.0,-1.0,2);
  dash::add_vertex(&local_1e0,2.0,-1.0,2);
  dash::add_vertex(&local_1e0,0.0,0.0,0x30);
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_108.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_108.x = local_188[0].x;
  local_108.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_f4 = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_fc = local_188[0].x;
  rStack_f8 = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_f0.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_f0.x = local_188[0].x;
  local_f0.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_e4.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_e4.x = local_188[0].x;
  local_e4.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_d8.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_d8.x = local_188[0].x;
  local_d8.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_cc.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_cc.x = local_188[0].x;
  local_cc.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_c0.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_c0.x = local_188[0].x;
  local_c0.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_b4.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_b4.x = local_188[0].x;
  local_b4.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_a8.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_a8.x = local_188[0].x;
  local_a8.y = local_188[0].y;
  local_188[0].command = 0;
  local_188[0].x = 0.0;
  local_188[0].y = 0.0;
  local_9c.command = dash::vertex(&local_1e0,&local_188[0].x,&local_188[0].y);
  local_9c.x = local_188[0].x;
  local_9c.y = local_188[0].y;
  puVar4 = &DAT_0019ec20;
  ppVar5 = local_188;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *puVar4;
    ppVar5->x = (real_t)(int)uVar1;
    ppVar5->y = (real_t)(int)((ulong)uVar1 >> 0x20);
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    ppVar5 = (point *)((long)ppVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_50,&local_90,300);
  lVar3 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_188[0].x + lVar3),
                       (point *)((long)&local_108.x + lVar3));
    if (!bVar2) {
      this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(this_00,&local_70,&local_50);
      __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
    operator_delete(local_50.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_1e0._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_1e0._pattern._begin);
  }
  if (local_1e0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_1e0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( ClosedPolygonProducesDashesForTheClosingSegment )
			{
				// INIT
				dash d;

				d.add_dash(2.0f, 1.0f);

				// ACT
				move_to(d, -2.0f, 2.0f);
				line_to(d, -2.0f, -1.0f);
				line_to(d, 2.0f, -1.0f);
				end_poly(d, true);

				mocks::path::point result[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference[] = {
					{ -2.0f, 2.0f, path_command_move_to }, { -2.0f, 0.0f, path_command_line_to },
					{ -2.0f, -1.0f, path_command_move_to }, { 0.0f, -1.0f, path_command_line_to },
					{ 1.0f, -1.0f, path_command_move_to }, { 2.0f, -1.0f, path_command_line_to }, { 1.2f, -0.4f, path_command_line_to },
					{ 0.4f, 0.2f, path_command_move_to }, { -1.2f, 1.4f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference, result);
			}